

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O0

PaError Pa_GetSampleSize(PaSampleFormat format)

{
  PaError local_14;
  int result;
  PaSampleFormat format_local;
  
  switch(format & 0xffffffff7fffffff) {
  case 1:
  case 2:
    local_14 = 4;
    break;
  default:
    local_14 = -0x270a;
    break;
  case 4:
    local_14 = 3;
    break;
  case 8:
    local_14 = 2;
    break;
  case 0x10:
  case 0x20:
    local_14 = 1;
  }
  return local_14;
}

Assistant:

PaError Pa_GetSampleSize( PaSampleFormat format )
{
    int result;

    PA_LOGAPI_ENTER_PARAMS( "Pa_GetSampleSize" );
    PA_LOGAPI(("\tPaSampleFormat format: %d\n", format ));

    switch( format & ~paNonInterleaved )
    {

    case paUInt8:
    case paInt8:
        result = 1;
        break;

    case paInt16:
        result = 2;
        break;

    case paInt24:
        result = 3;
        break;

    case paFloat32:
    case paInt32:
        result = 4;
        break;

    default:
        result = paSampleFormatNotSupported;
        break;
    }

    PA_LOGAPI_EXIT_PAERROR_OR_T_RESULT( "Pa_GetSampleSize", "int: %d", result );

    return (PaError) result;
}